

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

size_t Catch::listTests(Config *config)

{
  SourceLineInfo *pSVar1;
  Config *config_00;
  pointer pTVar2;
  pointer pTVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar6;
  undefined4 extraout_var_00;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  ostream *poVar7;
  ostream *poVar8;
  long lVar9;
  char *pcVar10;
  SourceLineInfo *value;
  Colour colourGuard;
  string description;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  char local_a9;
  type local_a8;
  Config *local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  size_t local_58;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_50;
  pointer local_38;
  
  iVar4 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  local_88 = config;
  iVar5 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xe])(config);
  if ((char)iVar5 == '\0') {
    pcVar10 = "All available test cases:\n";
    lVar9 = 0x1a;
  }
  else {
    pcVar10 = "Matching test cases:\n";
    lVar9 = 0x15;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar9);
  pSVar6 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar5 = (*(pSVar6->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar6);
  config_00 = local_88;
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x18))
                        ((long *)CONCAT44(extraout_var_00,iVar5),local_88);
  filterTests(&local_50,testCases,(TestSpec *)CONCAT44(extraout_var,iVar4),&config_00->super_IConfig
             );
  local_38 = local_50.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_50.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    value = &((local_50.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_TestCaseInfo).lineInfo;
    do {
      local_a9 = '\0';
      Colour::use((*(int *)&value[1].file << 0x1e) >> 0x1f & FileName);
      clara::TextFlow::Column::Column((Column *)local_80,(string *)(value + -9));
      local_58 = 2;
      local_68._8_8_ = 4;
      poVar7 = clara::TextFlow::operator<<((ostream *)&std::cout,(Column *)local_80);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\n",1);
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_80);
      iVar4 = (*(local_88->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x14])();
      if (1 < iVar4) {
        StringMaker<Catch::SourceLineInfo,_void>::convert<Catch::SourceLineInfo>(&local_a8,value);
        clara::TextFlow::Column::Column((Column *)local_80,&local_a8);
        local_68._8_8_ = 4;
        poVar7 = clara::TextFlow::operator<<((ostream *)&std::cout,(Column *)local_80);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,value[-5].file,value[-5].file + value[-5].line);
        if (local_a8._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)0x0,0x16f113);
        }
        clara::TextFlow::Column::Column((Column *)local_80,&local_a8);
        local_68._8_8_ = 4;
        poVar7 = clara::TextFlow::operator<<((ostream *)&std::cout,(Column *)local_80);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
      }
      if (value[-3].file != (char *)value[-3].line) {
        TestCaseInfo::tagsAsString_abi_cxx11_(&local_a8,(TestCaseInfo *)(value + -9));
        clara::TextFlow::Column::Column((Column *)local_80,&local_a8);
        local_68._8_8_ = 6;
        poVar7 = clara::TextFlow::operator<<((ostream *)&std::cout,(Column *)local_80);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\n",1);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_a9 == '\0') {
        Colour::use(None);
      }
      pSVar1 = value + 2;
      value = (SourceLineInfo *)&value[0xb].line;
    } while ((pointer)&pSVar1->line != local_38);
  }
  iVar4 = (*(local_88->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xe])();
  pTVar3 = local_50.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar2 = local_50.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((char)iVar4 == '\0') {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"test case","");
    local_80 = (undefined1  [8])(((long)pTVar3 - (long)pTVar2 >> 3) * -0x2c8590b21642c859);
    local_78._M_p = (pointer)&local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    operator<<((ostream *)&std::cout,(pluralise *)local_80);
    local_a9 = '\n';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_a9,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"matching test case","");
    local_80 = (undefined1  [8])(((long)pTVar3 - (long)pTVar2 >> 3) * -0x2c8590b21642c859);
    local_78._M_p = (pointer)&local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    operator<<((ostream *)&std::cout,(pluralise *)local_80);
    local_a9 = '\n';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_a9,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_50);
  return ((long)local_50.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_50.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x2c8590b21642c859;
}

Assistant:

std::size_t listTests( Config const& config ) {
        TestSpec const& testSpec = config.testSpec();
        if( config.hasTestFilters() )
            Catch::cout() << "Matching test cases:\n";
        else {
            Catch::cout() << "All available test cases:\n";
        }

        auto matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCaseInfo : matchedTestCases ) {
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard( colour );

            Catch::cout() << Column( testCaseInfo.name ).initialIndent( 2 ).indent( 4 ) << "\n";
            if( config.verbosity() >= Verbosity::High ) {
                Catch::cout() << Column( Catch::Detail::stringify( testCaseInfo.lineInfo ) ).indent(4) << std::endl;
                std::string description = testCaseInfo.description;
                if( description.empty() )
                    description = "(NO DESCRIPTION)";
                Catch::cout() << Column( description ).indent(4) << std::endl;
            }
            if( !testCaseInfo.tags.empty() )
                Catch::cout() << Column( testCaseInfo.tagsAsString() ).indent( 6 ) << "\n";
        }

        if( !config.hasTestFilters() )
            Catch::cout() << pluralise( matchedTestCases.size(), "test case" ) << '\n' << std::endl;
        else
            Catch::cout() << pluralise( matchedTestCases.size(), "matching test case" ) << '\n' << std::endl;
        return matchedTestCases.size();
    }